

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool leveldb::Version::RecordReadSample(leveldb::Slice)::State::Match(void*,int,leveldb::
     FileMetaData__(void *arg,int level,FileMetaData *f)

{
  long lVar1;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  State *state;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(int *)(in_RDI + 2) = *(int *)(in_RDI + 2) + 1;
  if (*(int *)(in_RDI + 2) == 1) {
    *in_RDI = in_RDX;
    *(undefined4 *)(in_RDI + 1) = in_ESI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return *(int *)(in_RDI + 2) < 2;
  }
  __stack_chk_fail();
}

Assistant:

static bool Match(void* arg, int level, FileMetaData* f) {
      State* state = reinterpret_cast<State*>(arg);
      state->matches++;
      if (state->matches == 1) {
        // Remember first match.
        state->stats.seek_file = f;
        state->stats.seek_file_level = level;
      }
      // We can stop iterating once we have a second match.
      return state->matches < 2;
    }